

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::Chapters::Edition::Clear(Edition *this)

{
  Atom *pAVar1;
  Atom *this_00;
  long *in_RDI;
  Atom *unaff_retaddr;
  Atom *a;
  
  while (0 < *(int *)((long)in_RDI + 0xc)) {
    *(int *)((long)in_RDI + 0xc) = *(int *)((long)in_RDI + 0xc) + -1;
    Atom::Clear(unaff_retaddr);
  }
  pAVar1 = (Atom *)*in_RDI;
  if (pAVar1 != (Atom *)0x0) {
    this_00 = pAVar1 + *(long *)&pAVar1[-1].m_displays_size;
    while (pAVar1 != this_00) {
      this_00 = this_00 + -1;
      Atom::~Atom(this_00);
    }
    operator_delete__(&pAVar1[-1].m_displays_size);
  }
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 1) = 0;
  return;
}

Assistant:

void Chapters::Edition::Clear() {
  while (m_atoms_count > 0) {
    Atom& a = m_atoms[--m_atoms_count];
    a.Clear();
  }

  delete[] m_atoms;
  m_atoms = NULL;

  m_atoms_size = 0;
}